

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashDeleteEntry(SyHash *pHash,SyHashEntry_Pr *pEntry,void **ppUserData)

{
  sxi32 sVar1;
  sxi32 rc;
  void **ppUserData_local;
  SyHashEntry_Pr *pEntry_local;
  SyHash *pHash_local;
  
  if (pEntry->pPrevCollide == (SyHashEntry_Pr *)0x0) {
    pHash->apBucket[pEntry->nHash & pHash->nBucketSize - 1] = pEntry->pNextCollide;
  }
  else {
    pEntry->pPrevCollide->pNextCollide = pEntry->pNextCollide;
  }
  if (pEntry->pNextCollide != (SyHashEntry_Pr *)0x0) {
    pEntry->pNextCollide->pPrevCollide = pEntry->pPrevCollide;
  }
  if (pHash->pList == pEntry) {
    pHash->pList = pHash->pList->pNext;
  }
  if (pEntry->pPrev != (SyHashEntry_Pr *)0x0) {
    pEntry->pPrev->pNext = pEntry->pNext;
  }
  if (pEntry->pNext != (SyHashEntry_Pr *)0x0) {
    pEntry->pNext->pPrev = pEntry->pPrev;
  }
  pHash->nEntry = pHash->nEntry - 1;
  if (ppUserData != (void **)0x0) {
    *ppUserData = pEntry->pUserData;
  }
  sVar1 = SyMemBackendPoolFree(pHash->pAllocator,pEntry);
  return sVar1;
}

Assistant:

static sxi32 HashDeleteEntry(SyHash *pHash, SyHashEntry_Pr *pEntry, void **ppUserData)
{
	sxi32 rc;
	if( pEntry->pPrevCollide == 0 ){
		pHash->apBucket[pEntry->nHash & (pHash->nBucketSize - 1)] = pEntry->pNextCollide;
	}else{
		pEntry->pPrevCollide->pNextCollide = pEntry->pNextCollide;
	}
	if( pEntry->pNextCollide ){
		pEntry->pNextCollide->pPrevCollide = pEntry->pPrevCollide;
	}
	MACRO_LD_REMOVE(pHash->pList, pEntry);
	pHash->nEntry--;
	if( ppUserData ){
		/* Write a pointer to the user data */
		*ppUserData = pEntry->pUserData;
	}
	/* Release the entry */
	rc = SyMemBackendPoolFree(pHash->pAllocator, pEntry);
	return rc;
}